

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipc.c
# Opt level: O1

pint p_ipc_unix_create_key_file(pchar *file_name)

{
  int iVar1;
  pint pVar2;
  int *piVar3;
  
  if (file_name == (pchar *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = open(file_name,0xc0,0x1a0);
    if (iVar1 != -1) {
      pVar2 = p_sys_close(iVar1);
      return pVar2;
    }
    piVar3 = __errno_location();
    iVar1 = (uint)(*piVar3 == 0x11) * 2 + -1;
  }
  return iVar1;
}

Assistant:

pint
p_ipc_unix_create_key_file (const pchar *file_name)
{
	pint fd;

	if (P_UNLIKELY (file_name == NULL))
		return -1;

	if ((fd = open (file_name, O_CREAT | O_EXCL | O_RDONLY, 0640)) == -1)
		/* file already exists */
		return (errno == EEXIST) ? 1 : -1;
	else
		return p_sys_close (fd);
}